

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O1

void cmSystemTools::Message(string *m,cmMessageMetadata *md)

{
  ostream *poVar1;
  
  if ((anonymous_namespace)::s_MessageCallback_abi_cxx11_._16_8_ != 0) {
    (*(code *)(anonymous_namespace)::s_MessageCallback_abi_cxx11_._24_8_)
              ((anonymous_namespace)::s_MessageCallback_abi_cxx11_,m,md,
               (anonymous_namespace)::s_MessageCallback_abi_cxx11_._24_8_);
    return;
  }
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(m->_M_dataplus)._M_p,m->_M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

void cmSystemTools::Message(const std::string& m, const cmMessageMetadata& md)
{
  if (s_MessageCallback) {
    s_MessageCallback(m, md);
  } else {
    std::cerr << m << std::endl;
  }
}